

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O1

int ffainit(fitsfile *fptr,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  void *pvVar3;
  long lVar4;
  LONGLONG *pLVar5;
  int iVar6;
  tcolumn *ptVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  size_t sVar13;
  char *pcVar14;
  LONGLONG rowlen;
  long tfield;
  LONGLONG nrows;
  LONGLONG pcount;
  char name [75];
  char message [81];
  char value [71];
  char comm [73];
  LONGLONG local_1a8;
  int local_1a0;
  undefined4 uStack_19c;
  long local_198;
  long local_190;
  int local_188 [20];
  char local_138 [96];
  char local_d8 [80];
  char local_88 [88];
  
  if (0 < *status) {
    return *status;
  }
  if (fptr->HDUposition != fptr->Fptr->curhdu) {
    ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
  }
  pFVar2 = fptr->Fptr;
  pFVar2->hdutype = 1;
  pFVar2->headend = pFVar2->logfilesize;
  iVar6 = ffgttb(fptr,&local_1a8,&local_198,&local_190,(long *)&local_1a0,status);
  if (0 < iVar6) {
    return *status;
  }
  if (local_190 != 0) {
    ffxmsg(5,"PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
    snprintf(local_138,0x51,"  PCOUNT = %ld",local_190);
    ffxmsg(5,local_138);
    *status = 0xd6;
    return 0xd6;
  }
  pFVar2 = fptr->Fptr;
  pFVar2->rowlength = local_1a8;
  pFVar2->tfield = local_1a0;
  if (pFVar2->tilerow != (int *)0x0) {
    uVar12 = (uint)((pFVar2->znaxis[0] + -1) / pFVar2->tilesize[0]);
    if (uVar12 < 0x7fffffff) {
      uVar10 = 0;
      do {
        pvVar3 = fptr->Fptr->tiledata[uVar10];
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        pvVar3 = fptr->Fptr->tilenullarray[uVar10];
        if (pvVar3 != (void *)0x0) {
          free(pvVar3);
        }
        uVar10 = uVar10 + 1;
      } while (uVar12 + 1 != uVar10);
    }
    free(fptr->Fptr->tileanynull);
    free(fptr->Fptr->tiletype);
    free(fptr->Fptr->tiledatasize);
    free(fptr->Fptr->tilenullarray);
    free(fptr->Fptr->tiledata);
    free(fptr->Fptr->tilerow);
    pFVar2 = fptr->Fptr;
    pFVar2->tilenullarray = (void **)0x0;
    pFVar2->tileanynull = (int *)0x0;
    pFVar2->tiletype = (int *)0x0;
    pFVar2->tiledata = (void **)0x0;
    pFVar2->tilerow = (int *)0x0;
    pFVar2->tiledatasize = (long *)0x0;
  }
  ptVar7 = fptr->Fptr->tableptr;
  if (ptVar7 != (tcolumn *)0x0) {
    free(ptVar7);
  }
  sVar13 = CONCAT44(uStack_19c,local_1a0);
  if ((long)sVar13 < 1) {
    ptVar7 = (tcolumn *)0x0;
  }
  else {
    ptVar7 = (tcolumn *)calloc(sVar13,0xa0);
    if (ptVar7 == (tcolumn *)0x0) {
      ffxmsg(5,"malloc failed to get memory for FITS table descriptors (ffainit)");
      fptr->Fptr->tableptr = (tcolumn *)0x0;
      *status = 0x6f;
      return 0x6f;
    }
  }
  pFVar2 = fptr->Fptr;
  pFVar2->tableptr = ptVar7;
  if (0 < (long)sVar13) {
    do {
      ptVar7->ttype[0] = '\0';
      ptVar7->tscale = 1.0;
      ptVar7->tzero = 0.0;
      ptVar7->strnull[0] = '\x01';
      ptVar7->tbcol = -1;
      ptVar7->tdatatype = -9999;
      ptVar7 = ptVar7 + 1;
      sVar13 = sVar13 - 1;
    } while (sVar13 != 0);
  }
  pFVar2->numrows = local_198;
  pFVar2->origrows = local_198;
  pFVar2->heapstart = local_198 * local_1a8;
  pFVar2->heapsize = 0;
  pFVar2->compressimg = 0;
  iVar6 = 8;
  iVar11 = 0;
  do {
    ffgkyn(fptr,iVar6,(char *)local_188,local_d8,local_88,status);
    if (*status == 0xcf) {
LAB_0013f675:
      *status = 0;
    }
    else if (*status == 0xcd) {
      sVar13 = strlen(local_d8);
      (local_d8 + sVar13)[0] = '\'';
      (local_d8 + sVar13)[1] = '\0';
      goto LAB_0013f675;
    }
    iVar1 = *status;
    if (iVar1 == 0x6b) {
      ffxmsg(5,"END keyword not found in ASCII table header (ffainit).");
      *status = 0xd2;
      return 0xd2;
    }
    if (0 < iVar1) {
      return iVar1;
    }
    if ((char)local_188[0] == 'T') {
      ffgtbp(fptr,(char *)local_188,local_d8,status);
    }
    else if (((char)local_188[0] == 'E') && (local_188[0] == 0x444e45)) {
      pFVar2 = fptr->Fptr;
      if (0 < CONCAT44(uStack_19c,local_1a0)) {
        pcVar14 = pFVar2->tableptr->tform;
        lVar8 = 0;
        do {
          iVar6 = (int)lVar8;
          if (*(int *)(pcVar14 + -0x3c) == -9999) {
            ffkeyn("TFORM",iVar6 + 1,(char *)local_188,status);
            snprintf(local_138,0x51,"Required %s keyword not found (ffainit).",local_188);
            ffxmsg(5,local_138);
            *status = 0xe8;
            return 0xe8;
          }
          lVar9 = *(long *)(pcVar14 + -0x44);
          if (lVar9 == -1) {
            ffkeyn("TBCOL",iVar6 + 1,(char *)local_188,status);
            snprintf(local_138,0x51,"Required %s keyword not found (ffainit).",local_188);
            ffxmsg(5,local_138);
            *status = 0xe7;
            return 0xe7;
          }
          lVar4 = pFVar2->rowlength;
          if (lVar4 != 0) {
            if ((lVar9 < 0) || (lVar4 <= lVar9)) {
              ffkeyn("TBCOL",iVar6 + 1,(char *)local_188,status);
              snprintf(local_138,0x51,"Value of %s keyword out of range: %ld (ffainit).",local_188,
                       lVar9);
              ffxmsg(5,local_138);
              *status = 0xea;
              return 0xea;
            }
            if ((lVar4 != 0) && (lVar4 < lVar9 + *(long *)(pcVar14 + 0xc))) {
              snprintf(local_138,0x51,"Column %d is too wide to fit in table (ffainit)",
                       (ulong)(iVar6 + 1));
              ffxmsg(5,local_138);
              snprintf(local_138,0x51," TFORM = %s and NAXIS1 = %ld",pcVar14,fptr->Fptr->rowlength);
              ffxmsg(5,local_138);
              *status = 0xec;
              return 0xec;
            }
          }
          lVar8 = lVar8 + 1;
          pcVar14 = pcVar14 + 0xa0;
        } while (CONCAT44(uStack_19c,local_1a0) != lVar8);
      }
      pLVar5 = pFVar2->headstart;
      pFVar2->headend = pFVar2->nextkey - (long)(iVar11 * 0x50 + 0x50);
      lVar9 = ((pFVar2->nextkey + -0x50) / 0xb40) * 0xb40;
      pFVar2->datastart = lVar9 + 0xb40;
      lVar8 = local_198 * local_1a8 + 0xb3f;
      iVar6 = pFVar2->curhdu;
      pLVar5[(long)iVar6 + 1] =
           ((lVar8 / 0xb40) * 0xb40 - lVar8) + local_198 * local_1a8 + lVar9 + 0x167f;
      pFVar2->nextkey = pLVar5[iVar6];
      return iVar1;
    }
    iVar11 = iVar11 + 1;
    if ((local_d8[0] != '\0' || (char)local_188[0] != '\0') || local_88[0] != '\0') {
      iVar11 = 0;
    }
    iVar6 = iVar6 + 1;
  } while( true );
}

Assistant:

int ffainit(fitsfile *fptr,      /* I - FITS file pointer */
            int *status)         /* IO - error status     */
{
/*
  initialize the parameters defining the structure of an ASCII table 
*/
    int  ii, nspace, ntilebins;
    long tfield;
    LONGLONG pcount, rowlen, nrows, tbcoln;
    tcolumn *colptr = 0;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char message[FLEN_ERRMSG], errmsg[FLEN_ERRMSG];

    if (*status > 0)
        return(*status);

    /* reset position to the correct HDU if necessary */
    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);

    (fptr->Fptr)->hdutype = ASCII_TBL;  /* set that this is an ASCII table */
    (fptr->Fptr)->headend = (fptr->Fptr)->logfilesize;  /* set max size */

    /* get table parameters and test that the header is a valid: */
    if (ffgttb(fptr, &rowlen, &nrows, &pcount, &tfield, status) > 0)  
       return(*status);

    if (pcount != 0)
    {
       ffpmsg("PCOUNT keyword not equal to 0 in ASCII table (ffainit).");
       snprintf(errmsg, FLEN_ERRMSG,"  PCOUNT = %ld", (long) pcount);
       ffpmsg(errmsg);
       return(*status = BAD_PCOUNT);
    }

    (fptr->Fptr)->rowlength = rowlen; /* store length of a row */
    (fptr->Fptr)->tfield = tfield; /* store number of table fields in row */

     /* free the tile-compressed image cache, if it exists */
     if ((fptr->Fptr)->tilerow) {

           ntilebins = 
	    (((fptr->Fptr)->znaxis[0] - 1) / ((fptr->Fptr)->tilesize[0])) + 1;

           for (ii = 0; ii < ntilebins; ii++) {
             if ((fptr->Fptr)->tiledata[ii]) {
	       free((fptr->Fptr)->tiledata[ii]);
             }

             if ((fptr->Fptr)->tilenullarray[ii]) {
	       free((fptr->Fptr)->tilenullarray[ii]);
             }
            }
	    
	    free((fptr->Fptr)->tileanynull);
	    free((fptr->Fptr)->tiletype);	   
	    free((fptr->Fptr)->tiledatasize);
	    free((fptr->Fptr)->tilenullarray);
	    free((fptr->Fptr)->tiledata);
	    free((fptr->Fptr)->tilerow);

	    (fptr->Fptr)->tileanynull = 0;
	    (fptr->Fptr)->tiletype = 0;	   
	    (fptr->Fptr)->tiledatasize = 0;
	    (fptr->Fptr)->tilenullarray = 0;
	    (fptr->Fptr)->tiledata = 0;
	    (fptr->Fptr)->tilerow = 0;
     }

    if ((fptr->Fptr)->tableptr)
       free((fptr->Fptr)->tableptr); /* free memory for the old CHDU */

    /* mem for column structures ; space is initialized = 0 */
    if (tfield > 0)
    {
      colptr = (tcolumn *) calloc(tfield, sizeof(tcolumn) );
      if (!colptr)
      {
        ffpmsg
        ("malloc failed to get memory for FITS table descriptors (ffainit)");
        (fptr->Fptr)->tableptr = 0;  /* set a null table structure pointer */
        return(*status = ARRAY_TOO_BIG);
      }
    }

    /* copy the table structure address to the fitsfile structure */
    (fptr->Fptr)->tableptr = colptr; 

    /*  initialize the table field parameters */
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        colptr->ttype[0] = '\0';  /* null column name */
        colptr->tscale = 1.;
        colptr->tzero  = 0.;
        colptr->strnull[0] = ASCII_NULL_UNDEFINED;  /* null value undefined */
        colptr->tbcol = -1;          /* initialize to illegal value */
        colptr->tdatatype = -9999;   /* initialize to illegal value */
    }

    /*
      Initialize the fictitious heap starting address (immediately following
      the table data) and a zero length heap.  This is used to find the
      end of the table data when checking the fill values in the last block. 
      There is no special data following an ASCII table.
    */
    (fptr->Fptr)->numrows = nrows;
    (fptr->Fptr)->origrows = nrows;
    (fptr->Fptr)->heapstart = rowlen * nrows;
    (fptr->Fptr)->heapsize = 0;

    (fptr->Fptr)->compressimg = 0;  /* this is not a compressed image */

    /* now search for the table column keywords and the END keyword */

    for (nspace = 0, ii = 8; 1; ii++)  /* infinite loop  */
    {
        ffgkyn(fptr, ii, name, value, comm, status);

        /* try to ignore minor syntax errors */
        if (*status == NO_QUOTE)
        {
            strcat(value, "'");
            *status = 0;
        }
        else if (*status == BAD_KEYCHAR)
        {
            *status = 0;
        }

        if (*status == END_OF_FILE)
        {
            ffpmsg("END keyword not found in ASCII table header (ffainit).");
            return(*status = NO_END);
        }
        else if (*status > 0)
            return(*status);

        else if (name[0] == 'T')   /* keyword starts with 'T' ? */
            ffgtbp(fptr, name, value, status); /* test if column keyword */

        else if (!FSTRCMP(name, "END"))  /* is this the END keyword? */
            break;

        if (!name[0] && !value[0] && !comm[0])  /* a blank keyword? */
            nspace++;

        else
            nspace = 0;
    }

    /* test that all required keywords were found and have legal values */
    colptr = (fptr->Fptr)->tableptr;
    for (ii = 0; ii < tfield; ii++, colptr++)
    {
        tbcoln = colptr->tbcol;  /* the starting column number (zero based) */

        if (colptr->tdatatype == -9999)
        {
            ffkeyn("TFORM", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TFORM);
        }

        else if (tbcoln == -1)
        {
            ffkeyn("TBCOL", ii+1, name, status); /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Required %s keyword not found (ffainit).", name);
            ffpmsg(message);
            return(*status = NO_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                (tbcoln < 0 || tbcoln >= (fptr->Fptr)->rowlength ) )
        {
            ffkeyn("TBCOL", ii+1, name, status);  /* construct keyword name */
            snprintf(message,FLEN_ERRMSG,"Value of %s keyword out of range: %ld (ffainit).",
            name, (long) tbcoln);
            ffpmsg(message);
            return(*status = BAD_TBCOL);
        }

        else if ((fptr->Fptr)->rowlength != 0 && 
                 tbcoln + colptr->twidth > (fptr->Fptr)->rowlength )
        {
            snprintf(message,FLEN_ERRMSG,"Column %d is too wide to fit in table (ffainit)",
            ii+1);
            ffpmsg(message);
            snprintf(message, FLEN_ERRMSG," TFORM = %s and NAXIS1 = %ld",
                    colptr->tform, (long) (fptr->Fptr)->rowlength);
            ffpmsg(message);
            return(*status = COL_TOO_WIDE);
        }
    }

    /*
      now we know everything about the table; just fill in the parameters:
      the 'END' record is 80 bytes before the current position, minus
      any trailing blank keywords just before the END keyword.
    */
    (fptr->Fptr)->headend = (fptr->Fptr)->nextkey - (80 * (nspace + 1));
 
    /* the data unit begins at the beginning of the next logical block */
    (fptr->Fptr)->datastart = (((fptr->Fptr)->nextkey - 80) / 2880 + 1) 
                              * 2880;

    /* the next HDU begins in the next logical block after the data  */
    (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu + 1] =
         (fptr->Fptr)->datastart +
         ( ((LONGLONG)rowlen * nrows + 2879) / 2880 * 2880 );

    /* reset next keyword pointer to the start of the header */
    (fptr->Fptr)->nextkey = (fptr->Fptr)->headstart[ (fptr->Fptr)->curhdu ];

    return(*status);
}